

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::anon_unknown_0::checkHalfFilledImageOverdraw
               (TestLog *log,RenderTarget *m_renderTarget,ConstPixelBufferAccess *image,
               PixelBufferAccess *output)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MessageBuilder *this;
  bool local_1de;
  bool local_1dd;
  MessageBuilder local_1d0;
  bool local_4d;
  undefined1 local_4c [7];
  bool pixelValid;
  IVec4 cTest;
  int x;
  int y;
  bool faulty;
  int width;
  int height;
  PixelBufferAccess *output_local;
  ConstPixelBufferAccess *image_local;
  RenderTarget *m_renderTarget_local;
  TestLog *log_local;
  
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(image);
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(image);
  bVar1 = 0;
  tcu::clear(output,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK);
  for (cTest.m_data[3] = 0; cTest.m_data[3] < iVar3; cTest.m_data[3] = cTest.m_data[3] + 1) {
    for (cTest.m_data[2] = 0; cTest.m_data[2] < iVar4; cTest.m_data[2] = cTest.m_data[2] + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_4c,(int)image,cTest.m_data[2],cTest.m_data[3]);
      bVar2 = isBlack((IVec4 *)local_4c);
      local_1dd = true;
      if (!bVar2) {
        bVar2 = isHalfFilled((IVec4 *)local_4c);
        local_1dd = true;
        if (!bVar2) {
          iVar5 = tcu::RenderTarget::getNumSamples(m_renderTarget);
          local_1de = false;
          if (1 < iVar5) {
            local_1de = isLessThanHalfFilled((IVec4 *)local_4c);
          }
          local_1dd = local_1de;
        }
      }
      local_4d = local_1dd;
      if (local_1dd == false) {
        tcu::PixelBufferAccess::setPixel
                  (output,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,cTest.m_data[2]
                   ,cTest.m_data[3],0);
        bVar1 = 1;
      }
    }
  }
  if (bVar1 != 0) {
    tcu::TestLog::operator<<(&local_1d0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [23])"Faulty pixel(s) found.");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool checkHalfFilledImageOverdraw (tcu::TestLog& log, const tcu::RenderTarget& m_renderTarget, const ConstPixelBufferAccess& image, const PixelBufferAccess& output)
{
	const int			height				= image.getHeight();
	const int			width				= image.getWidth();

	bool				faulty				= false;

	tcu::clear(output, MASK_COLOR_OK);

	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const tcu::IVec4	cTest	= image.getPixelInt(x, y);

			const bool pixelValid = isBlack(cTest) || isHalfFilled(cTest) || (m_renderTarget.getNumSamples() > 1 && isLessThanHalfFilled(cTest));

			if (!pixelValid)
			{
				output.setPixel(MASK_COLOR_FAIL, x, y);
				faulty = true;
			}
		}
	}

	if (faulty)
		log << TestLog::Message << "Faulty pixel(s) found." << TestLog::EndMessage;

	return !faulty;
}